

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O0

void ftghtb_(int *A1,int *A2,int *A3,int *A4,int *A5,char *A6,int *A7,char *A8,char *A9,char *A10,
            int *A11,size_t C6,size_t C8,size_t C9,size_t C10)

{
  long fptr_00;
  fitsfile *__src;
  uint nelem;
  char *tfields_00;
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  long *tbcol;
  char **ppcVar4;
  char **ppcVar5;
  size_t sVar6;
  size_t sVar7;
  uint elem_len;
  uint uVar8;
  uint uVar9;
  size_t local_188;
  unsigned_long local_170;
  uint local_150;
  uint local_144;
  uint local_128;
  uint local_11c;
  uint local_f8;
  uint local_ec;
  int local_d0;
  int local_c8;
  int *status;
  long lStack_b0;
  int maxdim;
  long tfields;
  fitsfile *fptr;
  char *B10;
  uint B9M;
  uint B9N;
  char **B9;
  uint B8M;
  uint B8N;
  char **B8;
  long B7N;
  long *B7;
  uint B6M;
  uint B6N;
  char **B6;
  long B4;
  long B3;
  char *A6_local;
  int *A5_local;
  int *A4_local;
  int *A3_local;
  int *A2_local;
  int *A1_local;
  
  fptr = (fitsfile *)0x0;
  tfields = (long)gFitsFiles[*A1];
  local_d0 = *A2;
  B3 = (long)A6;
  A6_local = (char *)A5;
  A5_local = A4;
  A4_local = A3;
  A3_local = A2;
  A2_local = A1;
  ffgkyj((fitsfile *)tfields,"TFIELDS",&stack0xffffffffffffff50,(char *)0x0,A11);
  tfields_00 = A6_local;
  fptr_00 = tfields;
  local_c8 = (int)lStack_b0;
  if (-1 < local_d0) {
    if (lStack_b0 < local_d0) {
      local_d0 = local_c8;
    }
    local_c8 = local_d0;
  }
  B4 = (long)*A4_local;
  B6 = (char **)(long)*A5_local;
  elem_len = (uint)C6;
  iVar1 = num_elem((char *)B3,elem_len,local_c8,-1);
  if (iVar1 < 2) {
    local_ec = 1;
  }
  else {
    local_ec = num_elem((char *)B3,elem_len,local_c8,-1);
  }
  B7._4_4_ = local_ec;
  local_f8 = elem_len;
  if (C6 <= gMinStrLen) {
    local_f8 = (uint)gMinStrLen;
  }
  B7._0_4_ = local_f8 + 1;
  _B6M = (char **)malloc((ulong)local_ec << 3);
  pcVar2 = (char *)malloc((ulong)(B7._4_4_ * (int)B7));
  ppcVar3 = _B6M;
  uVar8 = B7._4_4_;
  iVar1 = (int)B7;
  *_B6M = pcVar2;
  pcVar2 = f2cstrv2((char *)B3,*_B6M,elem_len,(int)B7,B7._4_4_);
  ppcVar3 = vindex(ppcVar3,iVar1,uVar8,pcVar2);
  B8 = (char **)(long)*A3_local;
  tbcol = F2Clongv((long)B8,A7);
  uVar8 = (uint)C8;
  B7N = (long)tbcol;
  iVar1 = num_elem(A8,uVar8,local_c8,-1);
  if (iVar1 < 2) {
    local_11c = 1;
  }
  else {
    local_11c = num_elem(A8,uVar8,local_c8,-1);
  }
  B9._4_4_ = local_11c;
  local_128 = uVar8;
  if (C8 <= gMinStrLen) {
    local_128 = (uint)gMinStrLen;
  }
  B9._0_4_ = local_128 + 1;
  _B8M = (char **)malloc((ulong)local_11c << 3);
  pcVar2 = (char *)malloc((ulong)(B9._4_4_ * (int)B9));
  ppcVar4 = _B8M;
  uVar9 = B9._4_4_;
  iVar1 = (int)B9;
  *_B8M = pcVar2;
  pcVar2 = f2cstrv2(A8,*_B8M,uVar8,(int)B9,B9._4_4_);
  ppcVar4 = vindex(ppcVar4,iVar1,uVar9,pcVar2);
  uVar9 = (uint)C9;
  iVar1 = num_elem(A9,uVar9,local_c8,-1);
  if (iVar1 < 2) {
    local_144 = 1;
  }
  else {
    local_144 = num_elem(A9,uVar9,local_c8,-1);
  }
  B10._4_4_ = local_144;
  local_150 = uVar9;
  if (C9 <= gMinStrLen) {
    local_150 = (uint)gMinStrLen;
  }
  B10._0_4_ = local_150 + 1;
  _B9M = (char **)malloc((ulong)local_144 << 3);
  pcVar2 = (char *)malloc((ulong)(B10._4_4_ * (int)B10));
  ppcVar5 = _B9M;
  nelem = B10._4_4_;
  iVar1 = (int)B10;
  *_B9M = pcVar2;
  pcVar2 = f2cstrv2(A9,*_B9M,uVar9,(int)B10,B10._4_4_);
  ppcVar5 = vindex(ppcVar5,iVar1,nelem,pcVar2);
  if (gMinStrLen < C10) {
    local_170 = C10;
  }
  else {
    local_170 = gMinStrLen;
  }
  fptr = (fitsfile *)malloc(local_170 + 1);
  *(undefined1 *)((long)&fptr->HDUposition + C10) = 0;
  memcpy(fptr,A10,C10);
  pcVar2 = kill_trailing((char *)fptr,' ');
  ffghtb((fitsfile *)fptr_00,local_c8,&B4,(long *)&B6,(int *)tfields_00,ppcVar3,tbcol,ppcVar4,
         ppcVar5,pcVar2,A11);
  *A4_local = (int)B4;
  *A5_local = (int)B6;
  c2fstrv2(*_B6M,(char *)B3,(int)B7,elem_len,B7._4_4_);
  free(*_B6M);
  free(_B6M);
  C2Flongv((long)B8,A7,(long *)B7N);
  c2fstrv2(*_B8M,A8,(int)B9,uVar8,B9._4_4_);
  free(*_B8M);
  free(_B8M);
  c2fstrv2(*_B9M,A9,(int)B10,uVar9,B10._4_4_);
  free(*_B9M);
  free(_B9M);
  __src = fptr;
  if (fptr != (fitsfile *)0x0) {
    sVar6 = strlen((char *)fptr);
    if (sVar6 < C10) {
      local_188 = strlen((char *)fptr);
    }
    else {
      local_188 = C10;
    }
    memcpy(A10,__src,local_188);
    sVar6 = strlen((char *)fptr);
    if (sVar6 < C10) {
      sVar6 = strlen((char *)fptr);
      sVar7 = strlen((char *)fptr);
      memset(A10 + sVar6,0x20,C10 - sVar7);
    }
    free(fptr);
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTGHTB,ftghtb)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,PLONG,PLONG,PINT,PSTRINGV,LONGV,PSTRINGV,PSTRINGV,PSTRING,PINT,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(PLONG,3)
   QCF(PLONG,4)
   QCF(PINT,5)
   QCF(PSTRINGV,6)
   QCF(LONGV,7)
   QCF(PSTRINGV,8)
   QCF(PSTRINGV,9)
   QCF(PSTRING,10)
   QCF(PINT,11)

   fitsfile *fptr;
   long tfields;
   int maxdim,*status;

   fptr = TCF(ftghtb,FITSUNIT,1,0);
   status =  TCF(ftghtb,PINT,11,0);
   maxdim =  TCF(ftghtb,INT,2,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );
   maxdim = (maxdim<0) ? tfields : _cfMIN(tfields,maxdim);

   ffghtb(   fptr, maxdim
             TCF(ftghtb,PLONG,3,1)
             TCF(ftghtb,PLONG,4,1)
             TCF(ftghtb,PINT,5,1)
             TCF(ftghtb,PSTRINGV,6,1)
             TCF(ftghtb,LONGV,7,1)
             TCF(ftghtb,PSTRINGV,8,1)
             TCF(ftghtb,PSTRINGV,9,1)
             TCF(ftghtb,PSTRING,10,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(PLONG,3)
   RCF(PLONG,4)
   RCF(PINT,5)
   RCF(PSTRINGV,6)
   RCF(LONGV,7)
   RCF(PSTRINGV,8)
   RCF(PSTRINGV,9)
   RCF(PSTRING,10)
   RCF(PINT,11)
}